

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_database.cc
# Opt level: O3

void __thiscall
google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::EnsureFlat(DescriptorIndex *this)

{
  btree_set<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileCompare,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry>_>
  *this_00;
  btree_set<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolCompare,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry>_>
  *this_01;
  btree_set<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionCompare,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry>_>
  *this_02;
  size_type sVar1;
  size_type sVar2;
  size_type sVar3;
  iterator iVar4;
  iterator iVar5;
  iterator iVar6;
  iterator iVar7;
  iterator iVar8;
  iterator iVar9;
  btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileCompare,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry>,_256,_false>_>,_const_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry_&,_const_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry_*>
  __last1;
  btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolCompare,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry>,_256,_false>_>,_const_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry_&,_const_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry_*>
  __last1_00;
  btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionCompare,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry>,_256,_false>_>,_const_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry_&,_const_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry_*>
  __last1_01;
  btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileCompare,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry>,_256,_false>_>,_const_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry_&,_const_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry_*>
  __first1;
  btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolCompare,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry>,_256,_false>_>,_const_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry_&,_const_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry_*>
  __first1_00;
  btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionCompare,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry>,_256,_false>_>,_const_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry_&,_const_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry_*>
  __first1_01;
  vector<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry>_>
  new_flat;
  vector<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry>_>
  local_48;
  
  if ((this->all_values_).
      super__Vector_base<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::EncodedEntry,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::EncodedEntry>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage !=
      (this->all_values_).
      super__Vector_base<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::EncodedEntry,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::EncodedEntry>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    std::
    __shrink_to_fit_aux<std::vector<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::EncodedEntry,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::EncodedEntry>_>,_true>
    ::_S_do_it(&this->all_values_);
  }
  sVar1 = (this->by_name_).
          super_btree_set_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileCompare,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry>,_256,_false>_>_>
          .
          super_btree_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileCompare,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry>,_256,_false>_>_>
          .tree_.size_;
  if (sVar1 != 0) {
    this_00 = &this->by_name_;
    std::
    vector<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry>_>
    ::vector(&new_flat,
             ((long)(this->by_name_flat_).
                    super__Vector_base<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)(this->by_name_flat_).
                    super__Vector_base<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x3333333333333333 + sVar1,
             (allocator_type *)&local_48);
    iVar4 = absl::lts_20250127::container_internal::
            btree<absl::lts_20250127::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileCompare,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry>,_256,_false>_>
            ::begin((btree<absl::lts_20250127::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileCompare,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry>,_256,_false>_>
                     *)this_00);
    iVar5 = absl::lts_20250127::container_internal::
            btree<absl::lts_20250127::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileCompare,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry>,_256,_false>_>
            ::end((btree<absl::lts_20250127::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileCompare,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry>,_256,_false>_>
                   *)this_00);
    __last1._8_8_ = iVar5._8_8_ & 0xffffffff;
    __last1.node_ =
         (btree_node<absl::lts_20250127::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileCompare,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry>,_256,_false>_>
          *)iVar5.node_;
    __first1._12_4_ = 0;
    __first1.node_ =
         (btree_node<absl::lts_20250127::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileCompare,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry>,_256,_false>_>
          *)SUB128(iVar4._0_12_,0);
    __first1.position_ = SUB124(iVar4._0_12_,8);
    std::
    __merge<absl::lts_20250127::container_internal::btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry,google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileCompare,std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry>,256,false>>,google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry_const&,google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry_const*>,__gnu_cxx::__normal_iterator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry*,std::vector<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry,std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry>>>,google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry*,__gnu_cxx::__ops::_Iter_comp_iter<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileCompare>>
              (__first1,__last1,
               (this->by_name_flat_).
               super__Vector_base<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry>_>
               ._M_impl.super__Vector_impl_data._M_start,
               (this->by_name_flat_).
               super__Vector_base<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry>_>
               ._M_impl.super__Vector_impl_data._M_finish,
               new_flat.
               super__Vector_base<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry>_>
               ._M_impl.super__Vector_impl_data._M_start,
               (_Iter_comp_iter<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileCompare>
                )(this->by_name_).
                 super_btree_set_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileCompare,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry>,_256,_false>_>_>
                 .
                 super_btree_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileCompare,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry>,_256,_false>_>_>
                 .tree_.rightmost_.
                 super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::key_compare_adapter<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileCompare,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry>::checked_compare,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry>,_absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileCompare,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry>,_256,_false>_>_*>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL>,_true>
                 .
                 super_Storage<absl::lts_20250127::container_internal::key_compare_adapter<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileCompare,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry>::checked_compare,_0UL,_false>
                 .value.
                 super_checked_compare_base<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileCompare,_true>
                 .super_FileCompare.index);
    local_48.
    super__Vector_base<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         (pointer)(this->by_name_flat_).
                  super__Vector_base<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage;
    (this->by_name_flat_).
    super__Vector_base<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         new_flat.
         super__Vector_base<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    local_48.
    super__Vector_base<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry>_>
    ._M_impl.super__Vector_impl_data._M_start =
         (pointer)(this->by_name_flat_).
                  super__Vector_base<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry>_>
                  ._M_impl.super__Vector_impl_data._M_start;
    local_48.
    super__Vector_base<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         (pointer)(this->by_name_flat_).
                  super__Vector_base<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
    (this->by_name_flat_).
    super__Vector_base<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry>_>
    ._M_impl.super__Vector_impl_data._M_start =
         new_flat.
         super__Vector_base<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry>_>
         ._M_impl.super__Vector_impl_data._M_start;
    (this->by_name_flat_).
    super__Vector_base<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         new_flat.
         super__Vector_base<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    new_flat.
    super__Vector_base<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    new_flat.
    super__Vector_base<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    new_flat.
    super__Vector_base<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::
    vector<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry>_>
    ::~vector((vector<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry>_>
               *)&local_48);
    if ((this->by_name_).
        super_btree_set_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileCompare,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry>,_256,_false>_>_>
        .
        super_btree_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileCompare,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry>,_256,_false>_>_>
        .tree_.size_ != 0) {
      absl::lts_20250127::container_internal::
      btree_node<absl::lts_20250127::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileCompare,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry>,_256,_false>_>
      ::clear_and_delete((this_00->
                         super_btree_set_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileCompare,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry>,_256,_false>_>_>
                         ).
                         super_btree_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileCompare,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry>,_256,_false>_>_>
                         .tree_.root_,
                         (allocator_type *)
                         &(this->by_name_).
                          super_btree_set_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileCompare,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry>,_256,_false>_>_>
                          .
                          super_btree_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileCompare,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry>,_256,_false>_>_>
                          .tree_.rightmost_);
    }
    (this->by_name_).
    super_btree_set_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileCompare,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry>,_256,_false>_>_>
    .
    super_btree_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileCompare,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry>,_256,_false>_>_>
    .tree_.rightmost_.
    super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::key_compare_adapter<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileCompare,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry>::checked_compare,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry>,_absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileCompare,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry>,_256,_false>_>_*>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL>,_true>
    .
    super_Storage<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileCompare,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry>,_256,_false>_>_*,_2UL,_false>
    .value = (btree_node<absl::lts_20250127::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileCompare,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry>,_256,_false>_>
              *)absl::lts_20250127::container_internal::
                btree<absl::lts_20250127::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry,google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileCompare,std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry>,256,false>>
                ::EmptyNode()::empty_node;
    (this->by_name_).
    super_btree_set_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileCompare,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry>,_256,_false>_>_>
    .
    super_btree_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileCompare,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry>,_256,_false>_>_>
    .tree_.root_ = (node_type *)
                   absl::lts_20250127::container_internal::
                   btree<absl::lts_20250127::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry,google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileCompare,std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry>,256,false>>
                   ::EmptyNode()::empty_node;
    (this->by_name_).
    super_btree_set_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileCompare,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry>,_256,_false>_>_>
    .
    super_btree_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileCompare,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry>,_256,_false>_>_>
    .tree_.size_ = 0;
    std::
    vector<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry>_>
    ::~vector(&new_flat);
  }
  sVar2 = (this->by_symbol_).
          super_btree_set_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolCompare,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry>,_256,_false>_>_>
          .
          super_btree_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolCompare,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry>,_256,_false>_>_>
          .tree_.size_;
  if (sVar2 != 0) {
    this_01 = &this->by_symbol_;
    std::
    vector<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry>_>
    ::vector((vector<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry>_>
              *)&new_flat,
             ((long)(this->by_symbol_flat_).
                    super__Vector_base<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)(this->by_symbol_flat_).
                    super__Vector_base<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x3333333333333333 + sVar2,
             (allocator_type *)&local_48);
    iVar6 = absl::lts_20250127::container_internal::
            btree<absl::lts_20250127::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolCompare,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry>,_256,_false>_>
            ::begin((btree<absl::lts_20250127::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolCompare,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry>,_256,_false>_>
                     *)this_01);
    iVar7 = absl::lts_20250127::container_internal::
            btree<absl::lts_20250127::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolCompare,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry>,_256,_false>_>
            ::end((btree<absl::lts_20250127::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolCompare,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry>,_256,_false>_>
                   *)this_01);
    __last1_00._8_8_ = iVar7._8_8_ & 0xffffffff;
    __last1_00.node_ =
         (btree_node<absl::lts_20250127::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolCompare,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry>,_256,_false>_>
          *)iVar7.node_;
    __first1_00._12_4_ = 0;
    __first1_00.node_ =
         (btree_node<absl::lts_20250127::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolCompare,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry>,_256,_false>_>
          *)SUB128(iVar6._0_12_,0);
    __first1_00.position_ = SUB124(iVar6._0_12_,8);
    std::
    __merge<absl::lts_20250127::container_internal::btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry,google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolCompare,std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry>,256,false>>,google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry_const&,google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry_const*>,__gnu_cxx::__normal_iterator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry*,std::vector<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry,std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry>>>,google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry*,__gnu_cxx::__ops::_Iter_comp_iter<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolCompare>>
              (__first1_00,__last1_00,
               (this->by_symbol_flat_).
               super__Vector_base<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry>_>
               ._M_impl.super__Vector_impl_data._M_start,
               (this->by_symbol_flat_).
               super__Vector_base<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry>_>
               ._M_impl.super__Vector_impl_data._M_finish,
               (SymbolEntry *)
               new_flat.
               super__Vector_base<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry>_>
               ._M_impl.super__Vector_impl_data._M_start,
               (_Iter_comp_iter<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolCompare>
                )(this->by_symbol_).
                 super_btree_set_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolCompare,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry>,_256,_false>_>_>
                 .
                 super_btree_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolCompare,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry>,_256,_false>_>_>
                 .tree_.rightmost_.
                 super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::key_compare_adapter<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolCompare,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry>::checked_compare,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry>,_absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolCompare,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry>,_256,_false>_>_*>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL>,_true>
                 .
                 super_Storage<absl::lts_20250127::container_internal::key_compare_adapter<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolCompare,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry>::checked_compare,_0UL,_false>
                 .value.
                 super_checked_compare_base<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolCompare,_true>
                 .super_SymbolCompare.index);
    local_48.
    super__Vector_base<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         (pointer)(this->by_symbol_flat_).
                  super__Vector_base<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage;
    (this->by_symbol_flat_).
    super__Vector_base<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         (pointer)new_flat.
                  super__Vector_base<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage;
    local_48.
    super__Vector_base<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry>_>
    ._M_impl.super__Vector_impl_data._M_start =
         (pointer)(this->by_symbol_flat_).
                  super__Vector_base<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry>_>
                  ._M_impl.super__Vector_impl_data._M_start;
    local_48.
    super__Vector_base<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         (pointer)(this->by_symbol_flat_).
                  super__Vector_base<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
    (this->by_symbol_flat_).
    super__Vector_base<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry>_>
    ._M_impl.super__Vector_impl_data._M_start =
         (pointer)new_flat.
                  super__Vector_base<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry>_>
                  ._M_impl.super__Vector_impl_data._M_start;
    (this->by_symbol_flat_).
    super__Vector_base<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         (pointer)new_flat.
                  super__Vector_base<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
    new_flat.
    super__Vector_base<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    new_flat.
    super__Vector_base<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    new_flat.
    super__Vector_base<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::
    vector<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry>_>
    ::~vector((vector<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry>_>
               *)&local_48);
    if ((this->by_symbol_).
        super_btree_set_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolCompare,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry>,_256,_false>_>_>
        .
        super_btree_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolCompare,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry>,_256,_false>_>_>
        .tree_.size_ != 0) {
      absl::lts_20250127::container_internal::
      btree_node<absl::lts_20250127::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolCompare,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry>,_256,_false>_>
      ::clear_and_delete((this_01->
                         super_btree_set_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolCompare,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry>,_256,_false>_>_>
                         ).
                         super_btree_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolCompare,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry>,_256,_false>_>_>
                         .tree_.root_,
                         (allocator_type *)
                         &(this->by_symbol_).
                          super_btree_set_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolCompare,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry>,_256,_false>_>_>
                          .
                          super_btree_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolCompare,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry>,_256,_false>_>_>
                          .tree_.rightmost_);
    }
    (this->by_symbol_).
    super_btree_set_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolCompare,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry>,_256,_false>_>_>
    .
    super_btree_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolCompare,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry>,_256,_false>_>_>
    .tree_.rightmost_.
    super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::key_compare_adapter<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolCompare,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry>::checked_compare,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry>,_absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolCompare,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry>,_256,_false>_>_*>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL>,_true>
    .
    super_Storage<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolCompare,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry>,_256,_false>_>_*,_2UL,_false>
    .value = (btree_node<absl::lts_20250127::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolCompare,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry>,_256,_false>_>
              *)absl::lts_20250127::container_internal::
                btree<absl::lts_20250127::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry,google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolCompare,std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry>,256,false>>
                ::EmptyNode()::empty_node;
    (this->by_symbol_).
    super_btree_set_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolCompare,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry>,_256,_false>_>_>
    .
    super_btree_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolCompare,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry>,_256,_false>_>_>
    .tree_.root_ = (node_type *)
                   absl::lts_20250127::container_internal::
                   btree<absl::lts_20250127::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry,google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolCompare,std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry>,256,false>>
                   ::EmptyNode()::empty_node;
    (this->by_symbol_).
    super_btree_set_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolCompare,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry>,_256,_false>_>_>
    .
    super_btree_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolCompare,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry>,_256,_false>_>_>
    .tree_.size_ = 0;
    std::
    vector<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry>_>
    ::~vector((vector<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry>_>
               *)&new_flat);
  }
  sVar3 = (this->by_extension_).
          super_btree_set_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionCompare,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry>,_256,_false>_>_>
          .
          super_btree_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionCompare,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry>,_256,_false>_>_>
          .tree_.size_;
  if (sVar3 != 0) {
    this_02 = &this->by_extension_;
    std::
    vector<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry>_>
    ::vector((vector<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry>_>
              *)&new_flat,
             ((long)(this->by_extension_flat_).
                    super__Vector_base<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)(this->by_extension_flat_).
                    super__Vector_base<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 4) * -0x5555555555555555 + sVar3,
             (allocator_type *)&local_48);
    iVar8 = absl::lts_20250127::container_internal::
            btree<absl::lts_20250127::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionCompare,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry>,_256,_false>_>
            ::begin((btree<absl::lts_20250127::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionCompare,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry>,_256,_false>_>
                     *)this_02);
    iVar9 = absl::lts_20250127::container_internal::
            btree<absl::lts_20250127::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionCompare,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry>,_256,_false>_>
            ::end((btree<absl::lts_20250127::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionCompare,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry>,_256,_false>_>
                   *)this_02);
    __last1_01._8_8_ = iVar9._8_8_ & 0xffffffff;
    __last1_01.node_ =
         (btree_node<absl::lts_20250127::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionCompare,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry>,_256,_false>_>
          *)iVar9.node_;
    __first1_01._12_4_ = 0;
    __first1_01.node_ =
         (btree_node<absl::lts_20250127::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionCompare,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry>,_256,_false>_>
          *)SUB128(iVar8._0_12_,0);
    __first1_01.position_ = SUB124(iVar8._0_12_,8);
    std::
    __merge<absl::lts_20250127::container_internal::btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry,google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionCompare,std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry>,256,false>>,google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry_const&,google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry_const*>,__gnu_cxx::__normal_iterator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry*,std::vector<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry,std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry>>>,google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry*,__gnu_cxx::__ops::_Iter_comp_iter<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionCompare>>
              (__first1_01,__last1_01,
               (this->by_extension_flat_).
               super__Vector_base<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry>_>
               ._M_impl.super__Vector_impl_data._M_start,
               (this->by_extension_flat_).
               super__Vector_base<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry>_>
               ._M_impl.super__Vector_impl_data._M_finish,
               (ExtensionEntry *)
               new_flat.
               super__Vector_base<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry>_>
               ._M_impl.super__Vector_impl_data._M_start,
               (_Iter_comp_iter<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionCompare>
                )(this->by_extension_).
                 super_btree_set_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionCompare,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry>,_256,_false>_>_>
                 .
                 super_btree_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionCompare,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry>,_256,_false>_>_>
                 .tree_.rightmost_.
                 super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::key_compare_adapter<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionCompare,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry>::checked_compare,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry>,_absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionCompare,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry>,_256,_false>_>_*>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL>,_true>
                 .
                 super_Storage<absl::lts_20250127::container_internal::key_compare_adapter<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionCompare,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry>::checked_compare,_0UL,_false>
                 .value.
                 super_checked_compare_base<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionCompare,_true>
                 .super_ExtensionCompare.index);
    local_48.
    super__Vector_base<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         (this->by_extension_flat_).
         super__Vector_base<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    (this->by_extension_flat_).
    super__Vector_base<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         (pointer)new_flat.
                  super__Vector_base<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage;
    local_48.
    super__Vector_base<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry>_>
    ._M_impl.super__Vector_impl_data._M_start =
         (this->by_extension_flat_).
         super__Vector_base<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry>_>
         ._M_impl.super__Vector_impl_data._M_start;
    local_48.
    super__Vector_base<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         (this->by_extension_flat_).
         super__Vector_base<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    (this->by_extension_flat_).
    super__Vector_base<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry>_>
    ._M_impl.super__Vector_impl_data._M_start =
         (pointer)new_flat.
                  super__Vector_base<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry>_>
                  ._M_impl.super__Vector_impl_data._M_start;
    (this->by_extension_flat_).
    super__Vector_base<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         (pointer)new_flat.
                  super__Vector_base<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
    new_flat.
    super__Vector_base<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    new_flat.
    super__Vector_base<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    new_flat.
    super__Vector_base<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::
    vector<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry>_>
    ::~vector(&local_48);
    if ((this->by_extension_).
        super_btree_set_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionCompare,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry>,_256,_false>_>_>
        .
        super_btree_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionCompare,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry>,_256,_false>_>_>
        .tree_.size_ != 0) {
      absl::lts_20250127::container_internal::
      btree_node<absl::lts_20250127::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionCompare,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry>,_256,_false>_>
      ::clear_and_delete((this_02->
                         super_btree_set_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionCompare,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry>,_256,_false>_>_>
                         ).
                         super_btree_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionCompare,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry>,_256,_false>_>_>
                         .tree_.root_,
                         (allocator_type *)
                         &(this->by_extension_).
                          super_btree_set_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionCompare,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry>,_256,_false>_>_>
                          .
                          super_btree_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionCompare,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry>,_256,_false>_>_>
                          .tree_.rightmost_);
    }
    (this->by_extension_).
    super_btree_set_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionCompare,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry>,_256,_false>_>_>
    .
    super_btree_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionCompare,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry>,_256,_false>_>_>
    .tree_.rightmost_.
    super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::key_compare_adapter<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionCompare,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry>::checked_compare,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry>,_absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionCompare,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry>,_256,_false>_>_*>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL>,_true>
    .
    super_Storage<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionCompare,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry>,_256,_false>_>_*,_2UL,_false>
    .value = (btree_node<absl::lts_20250127::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionCompare,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry>,_256,_false>_>
              *)absl::lts_20250127::container_internal::
                btree<absl::lts_20250127::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry,google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionCompare,std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry>,256,false>>
                ::EmptyNode()::empty_node;
    (this->by_extension_).
    super_btree_set_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionCompare,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry>,_256,_false>_>_>
    .
    super_btree_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionCompare,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry>,_256,_false>_>_>
    .tree_.root_ = (node_type *)
                   absl::lts_20250127::container_internal::
                   btree<absl::lts_20250127::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry,google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionCompare,std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry>,256,false>>
                   ::EmptyNode()::empty_node;
    (this->by_extension_).
    super_btree_set_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionCompare,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry>,_256,_false>_>_>
    .
    super_btree_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionCompare,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry>,_256,_false>_>_>
    .tree_.size_ = 0;
    std::
    vector<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry>_>
    ::~vector((vector<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry>_>
               *)&new_flat);
  }
  return;
}

Assistant:

void EncodedDescriptorDatabase::DescriptorIndex::EnsureFlat() {
  all_values_.shrink_to_fit();
  // Merge each of the sets into their flat counterpart.
  MergeIntoFlat(&by_name_, &by_name_flat_);
  MergeIntoFlat(&by_symbol_, &by_symbol_flat_);
  MergeIntoFlat(&by_extension_, &by_extension_flat_);
}